

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::CommaSeparatedList::~CommaSeparatedList(CommaSeparatedList *this)

{
  CommaSeparatedList *this_local;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CommaSeparatedList_0063c130;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
            (&this->items);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

CommaSeparatedList (const Context& c)
            : Expression (ObjectType::CommaSeparatedList, c, ExpressionKind::unknown)
        {
        }